

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

int tcdmain(int argc,char **argv,char *save_ext)

{
  uint uVar1;
  osfildef *fp;
  tcderrdef errcbcx;
  errdef fr_;
  errcxdef errctx;
  char vsnbuf [128];
  tcderrdef local_458;
  errdef local_428;
  errcxdef local_2f0;
  char local_a8 [128];
  
  local_458.tcderrfil = (FILE *)0x0;
  local_458.tcderrtok = (tokcxdef *)0x0;
  local_458.tcderrlvl = 0;
  local_458.tcderrcnt = 0;
  local_458.tcdwrncnt = 0;
  local_458.tcdfatal = 0;
  local_458.tcdwrn_AMBIGBIN = '\x01';
  local_458._33_7_ = 0;
  local_2f0.errcxlog = tcdlogerr;
  local_2f0.errcxlgc = (void *)0x0;
  local_2f0.errcxofs = 0;
  local_2f0.errcxfp = (osfildef *)0x0;
  local_2f0.errcxappctx = (appctxdef *)0x0;
  fp = oserrop(*argv);
  errini(&local_2f0,fp);
  sprintf(local_a8,"%s v%s.%s.%s  %s\n",tcgname,vsn_major,vsn_minor,vsn_maint,
          "Copyright (c) 1993, 2012 Michael J. Roberts");
  tcdptf(local_a8);
  sprintf(local_a8,"TADS for %s [%s] patchlevel %s.%s\n","POSIX/Unix/MS-Windows",
          "POSIX_UNIX_MSWINDOWS","1","0");
  tcdptf(local_a8);
  tcdptf("%s maintains this port.\n","Nikos Chantziaras <realnc@gmail.com>");
  local_428.errcode = _setjmp((__jmp_buf_tag *)local_428.errbuf);
  if (local_428.errcode == 0) {
    local_428.errprv = local_2f0.errcxptr;
    local_2f0.errcxptr = &local_428;
    tcdmain1(&local_2f0,argc,argv,&local_458,save_ext);
    local_2f0.errcxptr = local_428.errprv;
    if ((FILE *)local_2f0.errcxfp != (FILE *)0x0) {
      fclose((FILE *)local_2f0.errcxfp);
    }
    if ((FILE *)local_458.tcderrfil != (FILE *)0x0) {
      fclose((FILE *)local_458.tcderrfil);
    }
    maybe_pause();
    uVar1 = (uint)(local_458.tcderrcnt != 0);
  }
  else {
    local_2f0.errcxptr = local_428.errprv;
    if (local_428.errcode != 0x5dc) {
      (*local_2f0.errcxlog)
                (local_2f0.errcxlgc,local_428.errfac,local_428.errcode,local_428.erraac,
                 local_428.erraav);
    }
    if ((FILE *)local_2f0.errcxfp != (FILE *)0x0) {
      fclose((FILE *)local_2f0.errcxfp);
    }
    maybe_pause();
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int tcdmain(int argc, char **argv, char *save_ext)
{
    errcxdef   errctx;
    int        err;
    osfildef  *fp;
    extern     char tcgname[];
    tcderrdef  errcbcx;                           /* error callback context */
    char       vsnbuf[128];

    /* initialize the error structure */
    CLRSTRUCT(errcbcx);
    errcbcx.tcdwrn_AMBIGBIN = TRUE;                   /* -v+abin by default */

    errctx.errcxlog = tcdlogerr;
    errctx.errcxlgc = (void *)0;
    errctx.errcxofs = 0;
    errctx.errcxfp  = (osfildef *)0;
    errctx.errcxappctx = 0;
    fp = oserrop(argv[0]);
    errini(&errctx, fp);

    /* copyright-date-string */
    sprintf(vsnbuf, "%s v%s.%s.%s  %s\n", tcgname,
            vsn_major, vsn_minor, vsn_maint,
            "Copyright (c) 1993, 2012 Michael J. Roberts");
    tcdptf(vsnbuf);
    sprintf(vsnbuf, "TADS for %s [%s] patchlevel %s.%s\n",
            OS_SYSTEM_LDESC, OS_SYSTEM_NAME,
            TADS_OEM_VERSION, OS_SYSTEM_PATCHSUBLVL);
    tcdptf(vsnbuf);
    tcdptf("%s maintains this port.\n", TADS_OEM_NAME);
    
    ERRBEGIN(&errctx)
        tcdmain1(&errctx, argc, argv, &errcbcx, save_ext);
    ERRCATCH(&errctx, err)
        if (err != ERR_USAGE)
            errclog(&errctx);
    
        if (errctx.errcxfp) osfcls(errctx.errcxfp);
        if (errcbcx.tcderrfil) fclose(errcbcx.tcderrfil);
        /* os_expause(); */
        maybe_pause();
        return(OSEXFAIL);
    ERREND(&errctx)

    /* close message file */
    if (errctx.errcxfp) osfcls(errctx.errcxfp);

    /* close error echo file if any */
    if (errcbcx.tcderrfil) fclose(errcbcx.tcderrfil);

    /* os_expause(); */
    maybe_pause();
    return(errcbcx.tcderrcnt == 0 ? OSEXSUCC : OSEXFAIL);
}